

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O1

int inlist(char *filename)

{
  char *__s2;
  int iVar1;
  size_t sVar2;
  char **ppcVar3;
  
  ppcVar3 = files;
  if (*files != (char *)0x0) {
    sVar2 = strlen(filename);
    do {
      __s2 = *ppcVar3;
      if (__s2 == (char *)0x0) {
        return 0;
      }
      ppcVar3 = ppcVar3 + 1;
      iVar1 = strncmp(filename,__s2,(long)(int)sVar2);
    } while (iVar1 != 0);
  }
  return 1;
}

Assistant:

int
inlist(char *filename)
{
	register int len = strlen(filename);
	register char **filelist = files;

	if (!*filelist)
		return (1);				/* no "files list" */

	while (*filelist)
#ifdef __MSDOS__
		if (strnicmp(filename, *filelist++, len) == 0)
#else
		if (strncmp(filename, *filelist++, len) == 0)
#endif							/* __MSDOS__ */
			return (1);
	return (0);
}